

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O1

void __thiscall
Am_Inter_Location::Copy_From(Am_Inter_Location *this,Am_Inter_Location *other_data,bool make_unique)

{
  int iVar1;
  undefined4 extraout_var;
  Am_Inter_Location_Data *pAVar2;
  
  if (this->data == (Am_Inter_Location_Data *)0x0) {
    pAVar2 = (Am_Inter_Location_Data *)operator_new(0x40);
    Am_Inter_Location_Data::Am_Inter_Location_Data(pAVar2);
  }
  else {
    if (!make_unique) goto LAB_001b4fde;
    iVar1 = (*(this->data->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])()
    ;
    pAVar2 = (Am_Inter_Location_Data *)CONCAT44(extraout_var,iVar1);
  }
  this->data = pAVar2;
LAB_001b4fde:
  pAVar2 = this->data;
  Get_Location(other_data,&pAVar2->as_line,&pAVar2->ref_obj,(int *)&pAVar2->data,
               &(pAVar2->data).rect.top,&(pAVar2->data).rect.width,&(pAVar2->data).rect.height);
  return;
}

Assistant:

void
Am_Inter_Location::Copy_From(Am_Inter_Location &other_data, bool make_unique)
{
  if (data) {
    if (make_unique)
      data = (Am_Inter_Location_Data *)data->Make_Unique();
  } else
    data = new Am_Inter_Location_Data();
  other_data.Get_Location(data->as_line, data->ref_obj, data->data.line.x1,
                          data->data.line.y1, data->data.line.x2,
                          data->data.line.y2);
}